

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O0

int coda_cdf_reopen(coda_product **product)

{
  int iVar1;
  coda_cdf_product *product_file_00;
  char *pcVar2;
  coda_mem_record *pcVar3;
  int local_30;
  int local_2c;
  uint32_t magic [2];
  coda_type_record *root_definition;
  coda_cdf_product *product_file;
  coda_product **product_local;
  
  product_file_00 = (coda_cdf_product *)malloc(0x90);
  if (product_file_00 == (coda_cdf_product *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x90,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                   ,0x5d8);
    coda_close(*product);
    product_local._4_4_ = -1;
  }
  else {
    product_file_00->filename = (char *)0x0;
    product_file_00->file_size = (*product)->file_size;
    product_file_00->format = coda_format_cdf;
    product_file_00->root_type = (coda_mem_record *)0x0;
    product_file_00->product_definition = (coda_product_definition *)0x0;
    product_file_00->product_variable_size = (long *)0x0;
    product_file_00->product_variable = (int64_t **)0x0;
    product_file_00->mem_size = 0;
    product_file_00->mem_ptr = (uint8_t *)0x0;
    product_file_00->raw_product = *product;
    pcVar2 = strdup((*product)->filename);
    product_file_00->filename = pcVar2;
    if (product_file_00->filename == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not duplicate filename string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                     ,0x5ec);
      coda_cdf_close((coda_product *)product_file_00);
      product_local._4_4_ = -1;
    }
    else {
      iVar1 = read_bytes(product_file_00->raw_product,0,8,&local_30);
      if (iVar1 < 0) {
        coda_cdf_close((coda_product *)product_file_00);
        product_local._4_4_ = -1;
      }
      else {
        swap4(&local_30);
        swap4(&local_2c);
        if ((local_30 == 0xffff) || (local_30 == -0x320d9ffe)) {
          coda_set_error(-200,"CDF format version older than 3.0 is not supported");
          coda_cdf_close((coda_product *)product_file_00);
          product_local._4_4_ = -1;
        }
        else if (local_2c == -0x3333ffff) {
          coda_set_error(-200,"full file compression not supported for CDF files");
          coda_cdf_close((coda_product *)product_file_00);
          product_local._4_4_ = -1;
        }
        else {
          if ((local_30 != -0x320cffff) || (local_2c != 0xffff)) {
            __assert_fail("magic[0] == 0xCDF30001 && magic[1] == 0x0000FFFF",
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                          ,0x607,"int coda_cdf_reopen(coda_product **)");
          }
          magic = (uint32_t  [2])coda_type_record_new(coda_format_cdf);
          if (magic == (uint32_t  [2])0x0) {
            coda_cdf_close((coda_product *)product_file_00);
            product_local._4_4_ = -1;
          }
          else {
            pcVar3 = coda_mem_record_new((coda_type_record *)magic,(coda_dynamic_type *)0x0);
            product_file_00->root_type = pcVar3;
            if (product_file_00->root_type == (coda_mem_record *)0x0) {
              coda_cdf_close((coda_product *)product_file_00);
              coda_type_release((coda_type *)magic);
              product_local._4_4_ = -1;
            }
            else {
              coda_type_release((coda_type *)magic);
              iVar1 = read_file(product_file_00);
              if (iVar1 == 0) {
                *product = (coda_product *)product_file_00;
                product_local._4_4_ = 0;
              }
              else {
                coda_cdf_close((coda_product *)product_file_00);
                product_local._4_4_ = -1;
              }
            }
          }
        }
      }
    }
  }
  return product_local._4_4_;
}

Assistant:

int coda_cdf_reopen(coda_product **product)
{
    coda_cdf_product *product_file;
    coda_type_record *root_definition;
    uint32_t magic[2];

    product_file = (coda_cdf_product *)malloc(sizeof(coda_cdf_product));
    if (product_file == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       sizeof(coda_cdf_product), __FILE__, __LINE__);
        coda_close(*product);
        return -1;
    }
    product_file->filename = NULL;
    product_file->file_size = (*product)->file_size;
    product_file->format = coda_format_cdf;
    product_file->root_type = NULL;
    product_file->product_definition = NULL;
    product_file->product_variable_size = NULL;
    product_file->product_variable = NULL;
    product_file->mem_size = 0;
    product_file->mem_ptr = NULL;

    product_file->raw_product = *product;

    product_file->filename = strdup((*product)->filename);
    if (product_file->filename == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate filename string) (%s:%u)",
                       __FILE__, __LINE__);
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }

    /* magic */
    if (read_bytes(product_file->raw_product, 0, 8, magic) < 0)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_uint32(&magic[0]);
    swap_uint32(&magic[1]);
#endif
    if (magic[0] == 0x0000FFFF || magic[0] == 0xCDF26002)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF format version older than 3.0 is not supported");
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    if (magic[1] == 0xCCCC0001)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "full file compression not supported for CDF files");
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    assert(magic[0] == 0xCDF30001 && magic[1] == 0x0000FFFF);

    /* create root type */
    root_definition = coda_type_record_new(coda_format_cdf);
    if (root_definition == NULL)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    product_file->root_type = coda_mem_record_new(root_definition, NULL);
    if (product_file->root_type == NULL)
    {
        coda_cdf_close((coda_product *)product_file);
        coda_type_release((coda_type *)root_definition);
        return -1;
    }
    coda_type_release((coda_type *)root_definition);

    if (read_file(product_file) != 0)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }

    *product = (coda_product *)product_file;

    return 0;
}